

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scope.c
# Opt level: O3

char * ExpandScope(Scope *scope,int tab)

{
  int iVar1;
  char *right;
  bool bVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  
  iVar1 = scope->nodeLength;
  if (iVar1 < 1) {
    pcVar5 = "[";
  }
  else {
    bVar2 = true;
    pcVar5 = "[";
    lVar3 = 0;
    lVar4 = 0;
    do {
      if (((&scope->nodes->isStmt)[lVar3] == true) &&
         (*(int *)((long)&scope->nodes->scopeId + lVar3) == *scope->scopes)) {
        putchar(10);
        right = ExpandASTNode(scope,(ASTNode *)((long)&scope->nodes->type + lVar3),tab);
        if (!bVar2) {
          pcVar5 = Concat(pcVar5,",");
        }
        pcVar5 = Concat(pcVar5,right);
        iVar1 = scope->nodeLength;
        bVar2 = false;
      }
      lVar4 = lVar4 + 1;
      lVar3 = lVar3 + 0x38;
    } while (lVar4 < iVar1);
  }
  pcVar5 = Concat(pcVar5,"]");
  return pcVar5;
}

Assistant:

char* ExpandScope(Scope* scope, int tab){
	char* json = "[";
	bool first = true;
	for (int i = 0; i < scope->nodeLength; i++){
		if (scope->nodes[i].isStmt && scope->nodes[i].scopeId == scope->scopes[0]){
			printf("\n");
			char* results = ExpandASTNode(scope, &scope->nodes[i], tab);
			if (first) first = false;
			else json = Concat(json, ",");
			json = Concat(json, results);
		}
	}
	return Concat(json, "]");
}